

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::TestTextureCube::TestTextureCube
          (TestTextureCube *this,TextureFormat *format,int size)

{
  int iVar1;
  PixelBufferAccess *levelAccess;
  int local_34;
  int local_30;
  int faceNdx;
  int levelNdx;
  int size_local;
  TextureFormat *format_local;
  TestTextureCube *this_local;
  
  TestTexture::TestTexture(&this->super_TestTexture,format,size,size,1);
  (this->super_TestTexture)._vptr_TestTexture = (_func_int **)&PTR__TestTextureCube_01660fa8;
  tcu::TextureCube::TextureCube(&this->m_texture,format,size);
  local_30 = 0;
  while( true ) {
    iVar1 = (*(this->super_TestTexture)._vptr_TestTexture[2])();
    if (iVar1 <= local_30) break;
    for (local_34 = 0; local_34 < 6; local_34 = local_34 + 1) {
      tcu::TextureCube::allocLevel
                (&this->m_texture,*(CubeFace *)(tcuFaceMapping + (long)local_34 * 4),local_30);
      levelAccess = tcu::TextureCube::getLevelFace
                              (&this->m_texture,local_30,
                               *(CubeFace *)(tcuFaceMapping + (long)local_34 * 4));
      TestTexture::fillWithGradient(levelAccess);
    }
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

TestTextureCube::TestTextureCube (const tcu::TextureFormat& format, int size)
	: TestTexture	(format, size, size, 1)
	, m_texture		(format, size)
{
	for (int levelNdx = 0; levelNdx < getNumLevels(); levelNdx++)
	{
		for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
		{
			m_texture.allocLevel(tcuFaceMapping[faceNdx], levelNdx);
			TestTexture::fillWithGradient(m_texture.getLevelFace(levelNdx, tcuFaceMapping[faceNdx]));
		}
	}
}